

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedValues.cpp
# Opt level: O2

BoardSize Maps::getMapKeyByValue<BoardSize,unsigned_long>
                    (map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
                     *pairs,unsigned_long value)

{
  _Rb_tree_node_base *p_Var1;
  undefined8 *puVar2;
  
  p_Var1 = (pairs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(pairs->_M_t)._M_impl.super__Rb_tree_header) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "Exception : no key found in a map for a provided value";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    if (p_Var1[1]._M_parent == (_Base_ptr)value) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return p_Var1[1]._M_color;
}

Assistant:

T Maps::getMapKeyByValue( const std::map<T, U>& pairs, U value )
{
    for ( auto& pair : pairs )
    {
        if ( pair.second == value )
        {
            return pair.first;
        }
    }
    throw "Exception : no key found in a map for a provided value";
}